

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# value.cpp
# Opt level: O0

void mjs::throw_runtime_error(wstring_view *s,char *file,int line)

{
  wchar_t *__beg;
  wchar_t *__end;
  allocator<char> local_51;
  string local_50 [32];
  string_view local_30;
  int local_1c;
  char *pcStack_18;
  int line_local;
  char *file_local;
  wstring_view *s_local;
  
  local_1c = line;
  pcStack_18 = file;
  file_local = (char *)s;
  __beg = std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>::begin(s);
  __end = std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>::end
                    ((basic_string_view<wchar_t,_std::char_traits<wchar_t>_> *)file_local);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<wchar_t_const*,void>(local_50,__beg,__end,&local_51);
  local_30 = (string_view)std::__cxx11::string::operator_cast_to_basic_string_view(local_50);
  throw_runtime_error(&local_30,pcStack_18,local_1c);
}

Assistant:

[[noreturn]] void throw_runtime_error(const std::wstring_view& s, const char* file, int line) {
    throw_runtime_error(std::string(s.begin(), s.end()), file, line);
}